

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O0

bool __thiscall cmSourceFile::GetPropertyAsBool(cmSourceFile *this,string *prop)

{
  bool bVar1;
  cmValue val;
  string *prop_local;
  cmSourceFile *this_local;
  
  val = GetProperty(this,prop);
  bVar1 = cmIsOn(val);
  return bVar1;
}

Assistant:

bool cmSourceFile::GetPropertyAsBool(const std::string& prop) const
{
  return cmIsOn(this->GetProperty(prop));
}